

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void prepvarinfo(rnndb *db,char *what,rnnvarinfo *vi,rnnvarinfo *parent)

{
  byte bVar1;
  uint uVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  rnnenum *prVar7;
  rnnvarset **pprVar8;
  rnnvarset *prVar9;
  int *piVar10;
  rnnvarset *prVar11;
  char *pcVar12;
  char *name;
  rnnvalue *prVar13;
  uint uVar14;
  ulong uVar15;
  size_t sVar16;
  long lVar17;
  long lVar18;
  byte *pbVar19;
  byte *__string;
  byte *pbVar20;
  size_t sVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  
  if (parent != (rnnvarinfo *)0x0) {
    vi->prefenum = parent->prefenum;
  }
  pcVar12 = vi->prefixstr;
  if (pcVar12 != (char *)0x0) {
    iVar5 = strcmp(pcVar12,"none");
    if (iVar5 == 0) {
      prVar7 = (rnnenum *)0x0;
    }
    else {
      prVar7 = rnn_findenum(db,pcVar12);
    }
    vi->prefenum = prVar7;
  }
  if ((parent != (rnnvarinfo *)0x0) && (0 < parent->varsetsnum)) {
    iVar5 = vi->varsetsnum;
    lVar18 = 0;
    do {
      iVar6 = vi->varsetsmax;
      if (iVar6 <= iVar5) {
        iVar5 = iVar6 * 2;
        if (iVar6 == 0) {
          iVar5 = 0x10;
        }
        vi->varsetsmax = iVar5;
        pprVar8 = (rnnvarset **)realloc(vi->varsets,(long)iVar5 << 3);
        vi->varsets = pprVar8;
      }
      prVar11 = parent->varsets[lVar18];
      prVar9 = (rnnvarset *)calloc(0x10,1);
      prVar7 = prVar11->venum;
      prVar9->venum = prVar7;
      sVar21 = (size_t)prVar7->valsnum;
      piVar10 = (int *)calloc(4,sVar21);
      prVar9->variants = piVar10;
      if (0 < (long)sVar21) {
        piVar3 = prVar11->variants;
        sVar16 = 0;
        do {
          piVar10[sVar16] = piVar3[sVar16];
          sVar16 = sVar16 + 1;
        } while (sVar21 != sVar16);
      }
      iVar6 = vi->varsetsnum;
      iVar5 = iVar6 + 1;
      vi->varsetsnum = iVar5;
      vi->varsets[iVar6] = prVar9;
      lVar18 = lVar18 + 1;
    } while (lVar18 < parent->varsetsnum);
  }
  pcVar12 = vi->varsetstr;
  prVar7 = vi->prefenum;
  if (((prVar7 == (rnnenum *)0x0) && (parent != (rnnvarinfo *)0x0)) && (pcVar12 == (char *)0x0)) {
    pcVar12 = parent->varsetstr;
    vi->varsetstr = pcVar12;
  }
  if (pcVar12 != (char *)0x0) {
    prVar7 = rnn_findenum(db,pcVar12);
  }
  __string = (byte *)vi->variantsstr;
  if (__string != (byte *)0x0) {
    if (prVar7 == (rnnenum *)0x0) {
      fprintf(_stderr,"%s: tried to use variants without active varset!\n",what);
      db->estatus = 1;
      return;
    }
    uVar2 = prVar7->valsnum;
    iVar5 = vi->varsetsnum;
    if (0 < (long)iVar5) {
      lVar18 = 0;
      do {
        prVar11 = vi->varsets[lVar18];
        if (prVar11->venum == prVar7) goto LAB_00106609;
        lVar18 = lVar18 + 1;
      } while (iVar5 != lVar18);
    }
    prVar11 = (rnnvarset *)calloc(0x10,1);
    prVar11->venum = prVar7;
    piVar10 = (int *)calloc(4,(long)(int)uVar2);
    prVar11->variants = piVar10;
    auVar4 = _DAT_001082b0;
    if (0 < (int)uVar2) {
      lVar18 = (ulong)uVar2 - 1;
      auVar23._8_4_ = (int)lVar18;
      auVar23._0_8_ = lVar18;
      auVar23._12_4_ = (int)((ulong)lVar18 >> 0x20);
      lVar18 = 0;
      auVar23 = auVar23 ^ _DAT_001082b0;
      auVar24 = _DAT_00108290;
      auVar25 = _DAT_001082a0;
      do {
        auVar26 = auVar25 ^ auVar4;
        iVar6 = auVar23._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar6 && auVar23._0_4_ < auVar26._0_4_ ||
                    iVar6 < auVar26._4_4_) & 1)) {
          *(undefined4 *)((long)piVar10 + lVar18) = 1;
        }
        if ((auVar26._12_4_ != auVar23._12_4_ || auVar26._8_4_ <= auVar23._8_4_) &&
            auVar26._12_4_ <= auVar23._12_4_) {
          *(undefined4 *)((long)piVar10 + lVar18 + 4) = 1;
        }
        auVar26 = auVar24 ^ auVar4;
        iVar27 = auVar26._4_4_;
        if (iVar27 <= iVar6 && (iVar27 != iVar6 || auVar26._0_4_ <= auVar23._0_4_)) {
          *(undefined4 *)((long)piVar10 + lVar18 + 8) = 1;
          *(undefined4 *)((long)piVar10 + lVar18 + 0xc) = 1;
        }
        lVar17 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 4;
        auVar25._8_8_ = lVar17 + 4;
        lVar17 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 4;
        auVar24._8_8_ = lVar17 + 4;
        lVar18 = lVar18 + 0x10;
      } while ((ulong)(uVar2 + 3 >> 2) << 4 != lVar18);
    }
    iVar6 = vi->varsetsmax;
    if (iVar5 < iVar6) {
      pprVar8 = vi->varsets;
    }
    else {
      iVar5 = 0x10;
      if (iVar6 != 0) {
        iVar5 = iVar6 * 2;
      }
      vi->varsetsmax = iVar5;
      pprVar8 = (rnnvarset **)realloc(vi->varsets,(long)iVar5 << 3);
      vi->varsets = pprVar8;
      iVar5 = vi->varsetsnum;
    }
    vi->varsetsnum = iVar5 + 1;
    pprVar8[iVar5] = prVar11;
LAB_00106609:
    while( true ) {
      for (; bVar1 = *__string, bVar1 == 0x20; __string = __string + 1) {
      }
      pbVar19 = __string;
      pbVar20 = __string;
      if (bVar1 == 0) break;
      while( true ) {
        pbVar20 = pbVar20 + 1;
        if ((bVar1 < 0x3b) && ((0x400200100000001U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
        bVar1 = pbVar19[1];
        pbVar19 = pbVar19 + 1;
      }
      if ((long)pbVar19 - (long)__string == 0) {
        pcVar12 = (char *)0x0;
      }
      else {
        pcVar12 = strndup((char *)__string,(long)pbVar19 - (long)__string);
      }
      if ((bVar1 & 0xdf) == 0) {
        iVar5 = findvidx(db,prVar7,pcVar12);
        __string = pbVar19;
        if (iVar5 != -1) {
          prVar11->variants[iVar5] = prVar11->variants[iVar5] | 2;
        }
      }
      else {
        sVar21 = 0;
        for (; (*pbVar20 & 0xdf) != 0; pbVar20 = pbVar20 + 1) {
          sVar21 = sVar21 + 1;
        }
        if (sVar21 == 0) {
          name = (char *)0x0;
        }
        else {
          name = strndup((char *)(pbVar19 + 1),sVar21);
        }
        if (pcVar12 == (char *)0x0) {
          iVar5 = 0;
        }
        else {
          iVar5 = findvidx(db,prVar7,pcVar12);
        }
        uVar14 = uVar2;
        if (name != (char *)0x0) {
          iVar6 = findvidx(db,prVar7,name);
          uVar14 = (uint)(*pbVar19 == 0x2d) + iVar6;
        }
        if (((iVar5 != -1) && (uVar14 != 0xffffffff)) && (iVar5 < (int)uVar14)) {
          piVar10 = prVar11->variants;
          lVar18 = (long)iVar5;
          do {
            *(byte *)(piVar10 + lVar18) = *(byte *)(piVar10 + lVar18) | 2;
            lVar18 = lVar18 + 1;
          } while ((int)uVar14 != lVar18);
        }
        free(name);
        __string = pbVar20;
      }
      free(pcVar12);
    }
    vi->dead = 1;
    if (0 < (int)uVar2) {
      piVar10 = prVar11->variants;
      uVar15 = 0;
      do {
        bVar22 = piVar10[uVar15] == 3;
        piVar10[uVar15] = (uint)bVar22;
        if (bVar22) {
          vi->dead = 0;
        }
        uVar15 = uVar15 + 1;
      } while (uVar2 != uVar15);
    }
  }
  if (vi->dead != 0) {
    return;
  }
  prVar7 = vi->prefenum;
  if (prVar7 == (rnnenum *)0x0) {
    return;
  }
  if (0 < (long)vi->varsetsnum) {
    lVar18 = 0;
    do {
      if (vi->varsets[lVar18]->venum == prVar7) {
        if ((long)prVar7->valsnum < 1) {
          return;
        }
        lVar17 = 0;
        while (vi->varsets[lVar18]->variants[lVar17] == 0) {
          lVar17 = lVar17 + 1;
          if (prVar7->valsnum == lVar17) {
            return;
          }
        }
        prVar13 = prVar7->vals[lVar17];
        goto LAB_001067b3;
      }
      lVar18 = lVar18 + 1;
    } while (vi->varsetsnum != lVar18);
  }
  prVar13 = *prVar7->vals;
LAB_001067b3:
  vi->prefix = prVar13->name;
  return;
}

Assistant:

static void prepvarinfo (struct rnndb *db, char *what, struct rnnvarinfo *vi, struct rnnvarinfo *parent) {
	if (parent)
		vi->prefenum = parent->prefenum;
	if (vi->prefixstr) {
		if (!strcmp(vi->prefixstr, "none"))
			vi->prefenum = 0;
		else
			vi->prefenum = rnn_findenum(db, vi->prefixstr); // XXX
	}
	int i;
	if (parent)
		for (i = 0; i < parent->varsetsnum; i++)
			ADDARRAY(vi->varsets, copyvarset(parent->varsets[i]));
	struct rnnenum *varset = vi->prefenum;
	if (!varset && !vi->varsetstr && parent)
		vi->varsetstr = parent->varsetstr;
	if (vi->varsetstr)
		varset = rnn_findenum(db, vi->varsetstr);
	if (vi->variantsstr) {
		char *vars = vi->variantsstr;
		if (!varset) {
			fprintf (stderr, "%s: tried to use variants without active varset!\n", what);
			db->estatus = 1;
			return;
		}
		struct rnnvarset *vs = 0;
		int nvars = varset->valsnum;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == varset) {
				vs = vi->varsets[i];
				break;
			}
		if (!vs) {
			vs = calloc (sizeof *vs, 1);
			vs->venum = varset;
			vs->variants = calloc(sizeof *vs->variants, nvars);
			for (i = 0; i < nvars; i++)
				vs->variants[i] = 1;
			ADDARRAY(vi->varsets, vs);
		}
		while (1) {
			while (*vars == ' ') vars++;
			if (*vars == 0)
				break;
			char *split = vars;
			while (*split != ':' && *split != '-' && *split != ' '  && *split != 0)
				split++;
			char *first = 0;
			if (split != vars)
				first = strndup(vars, split-vars);
			if (*split == ' ' || *split == 0) {
				int idx = findvidx(db, varset, first);
				if (idx != -1)
					vs->variants[idx] |= 2;
				vars = split;
			} else {
				char *end = split+1;
				while (*end != ' '  && *end != 0)
					end++;
				char *second = 0;
				if (end != split+1)
					second = strndup(split+1, end-split-1);
				int idx1 = 0;
				if (first)
					idx1 = findvidx(db, varset, first);
				int idx2 = nvars;
				if (second) {
					idx2 = findvidx(db, varset, second);
					if (*split == '-')
						idx2++;
				}
				if (idx1 != -1 && idx2 != -1)
					for (i = idx1; i < idx2; i++)
						vs->variants[i] |= 2;
				vars = end;
				free(second);
			}
			free(first);
		}
		vi->dead = 1;
		for (i = 0; i < nvars; i++) {
			vs->variants[i] = (vs->variants[i] == 3);
			if (vs->variants[i])
				vi->dead = 0;
		}
	}
	if (vi->dead)
		return;
	if (vi->prefenum) {
		struct rnnvarset *vs = 0;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == vi->prefenum) {
				vs = vi->varsets[i];
				break;
			}
		if (vs) {
			for (i = 0; i < vi->prefenum->valsnum; i++)
				if (vs->variants[i]) {
					vi->prefix = vi->prefenum->vals[i]->name;
					return;
				}
		} else {
			vi->prefix = vi->prefenum->vals[0]->name;
		}
	}
}